

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvk_algorithm.c
# Opt level: O1

void fvk_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  solver_state_a s;
  int local_118 [4];
  long local_108;
  long local_100;
  long local_f0;
  long local_e8;
  long local_e0;
  
  setup_simple_state_a(&two_dof_robot_a,local_118);
  if (0 < local_118[0]) {
    lVar5 = 0;
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar4 = _two_dof_robot_c + lVar5 + 0x20;
      kca_fpk(lVar4,local_108 + lVar2);
      ga_pose_compose(local_108 + lVar2,_two_dof_robot_c + lVar5,local_100 + lVar2);
      kca_fvk(lVar4,local_f0 + lVar2);
      ga_twist_tf_ref_to_tgt(local_100 + lVar2,local_e0 + lVar2,local_e8 + lVar2);
      lVar1 = local_e8 + lVar2;
      lVar4 = local_f0 + lVar2;
      lVar2 = lVar2 + 0x20;
      ga_twist_accumulate(lVar1,lVar4,local_e0 + lVar2);
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 0x60;
    } while (lVar3 < local_118[0]);
  }
  ga_twist_log((long)local_118[0] * 0x20 + local_e0);
  return;
}

Assistant:

void fvk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);
    }

    ga_twist_log(&s.xd[s.nbody]);
}